

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O1

QPoint QHighDpi::fromNativeLocalPosition<QPoint,QWindow>(QPoint *value,QWindow *context)

{
  ulong uVar1;
  undefined4 extraout_EDX;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  ScaleAndOrigin SVar8;
  
  SVar8 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  dVar5 = 1.0 / SVar8.factor;
  dVar6 = dVar5 * (double)(*value).xp.m_i;
  dVar5 = dVar5 * (double)(*value).yp.m_i;
  auVar7._0_8_ = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
  auVar7._8_8_ = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
  auVar7 = minpd(_DAT_00684790,auVar7);
  auVar4._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
  auVar4._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
  uVar2 = movmskpd(extraout_EDX,auVar4);
  uVar3 = 0x8000000000000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar7._8_8_ << 0x20;
  }
  uVar1 = 0x80000000;
  if ((uVar2 & 1) != 0) {
    uVar1 = (ulong)(uint)(int)auVar7._0_8_;
  }
  return (QPoint)(uVar1 | uVar3);
}

Assistant:

T fromNativeLocalPosition(const T &value, const C *context)
{
    return scale(value, qreal(1) / QHighDpiScaling::factor(context));
}